

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O2

void __thiscall BmsParser::Parser::ParseMeasure(Parser *this,char *str)

{
  bool bVar1;
  int iVar2;
  uint pos;
  char *pcVar3;
  BmsBarManager *this_00;
  double l;
  char *local_48 [2];
  char local_38 [16];
  
  bVar1 = anon_unknown_2::IsBar(str);
  if (bVar1) {
    iVar2 = atoi(str + 3);
    if (iVar2 == 2) {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,str,str + 3);
      pos = atoi(local_48[0]);
      std::__cxx11::string::~string((string *)local_48);
      pcVar3 = anon_unknown_2::ParseColon(str);
      pcVar3 = anon_unknown_2::Trim(pcVar3);
      l = atof(pcVar3);
      this_00 = BmsBms::GetBarManager(this->bms_);
      BmsBarManager::SetRatio(this_00,pos,l,true);
    }
  }
  return;
}

Assistant:

void Parser::ParseMeasure(const char* str)
	{
		if (!IsBar(str)) return;
		// if channel isn't 02(BAR channel)
		// then ignore
		int channel = atoi(str + 3);
		if (channel != 2) return;
		int bar_ = atoi(std::string(str, 3).c_str());
		const char* value_s_ = ParseColon(str);
		if (!value_s_) {
			WriteLogLine("line %d - cannot parse measure length (%s)", line_, str);
			return;
		}
		double value_ = atof(Trim(value_s_));
		bms_.GetBarManager().SetRatio(bar_, value_);
	}